

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_impl.h
# Opt level: O2

void __thiscall
node::Node<label::JSONLabel>::Node(Node<label::JSONLabel> *this,ConstReference label)

{
  (this->children_).
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_).
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_).
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::label::JSONLabel::JSONLabel(&this->label_,label);
  return;
}

Assistant:

Node<Label>::Node(ConstReference label) : label_(label) {}